

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  undefined4 *puVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  Size *pSVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  string s_distance;
  string Xml_path;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> R_face;
  CascadeClassifier FaceDectector;
  VideoCapture cap;
  Mat frame;
  Mat Gray;
  Mat Reference_image;
  Mat G_Blur;
  undefined8 *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  float local_34c;
  long *local_348 [2];
  long local_338 [2];
  _InputArray local_328;
  long lStack_310;
  void *local_308;
  void *pvStack_300;
  long local_2f8;
  void *local_2e8;
  void *pvStack_2e0;
  long local_2d8;
  CascadeClassifier local_2c8 [16];
  _InputArray local_2b8;
  undefined8 uStack_2a0;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined4 local_1f8 [2];
  Mat *local_1f0;
  undefined8 uStack_1e8;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 local_1b8;
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  cv::CascadeClassifier::CascadeClassifier(local_2c8);
  cv::Mat::Mat(local_1b0);
  cv::Mat::Mat(local_150);
  cv::Mat::Mat(local_90);
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/haarcascade_frontalface_default.xml"
             ,"");
  cVar2 = cv::CascadeClassifier::load((string *)local_2c8);
  if (cVar2 == '\0') {
    iVar3 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"erro loading file xml face detector",0x23);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"HarrCascade xml  file is Loaded",0x1f);
    cv::Mat::Mat(local_f0);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_378,
               "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/reference_image.png"
               ,"");
    cv::imread((string *)&local_2b8,(int)&local_378);
    cv::Mat::operator=(local_f0,(Mat *)&local_2b8);
    cv::Mat::~Mat((Mat *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    local_2d8 = 0;
    local_2e8 = (void *)0x0;
    pvStack_2e0 = (void *)0x0;
    local_2b8.sz.width = 0;
    local_2b8.sz.height = 0;
    local_2b8.flags = 0x1010000;
    local_1b8 = 0;
    local_1c0 = 0;
    puVar7 = (undefined8 *)0x0;
    local_2b8.obj = local_f0;
    cv::CascadeClassifier::detectMultiScale(0xcccccccd,local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"before---------------------",0x1b);
    if (pvStack_2e0 == local_2e8) {
      local_34c = NAN;
    }
    else {
      uVar8 = 0;
      lVar9 = 0;
      do {
        lVar10 = lVar9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"reading===========",0x12);
        std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)local_2e8 + lVar10));
        puVar1 = (undefined4 *)((long)local_2e8 + lVar10);
        local_1d0 = *puVar1;
        uStack_1cc = puVar1[1];
        uStack_1c8 = puVar1[2];
        uStack_1c4 = puVar1[3];
        local_378.field_2._M_allocated_capacity = 0;
        local_378._M_dataplus._M_p._0_4_ = 0x3010000;
        local_2b8.flags = 0;
        local_2b8._4_4_ = 0;
        local_2b8.obj = (Mat *)0x406fe00000000000;
        local_2b8.sz.width = 0;
        local_2b8.sz.height = 0x406fe000;
        uStack_2a0 = 0;
        puVar7 = (undefined8 *)0x8;
        local_378._M_string_length = (size_type)local_f0;
        cv::rectangle(&local_378,&local_1d0,(_OutputArray *)&local_2b8,2,8,0);
        uVar8 = uVar8 + 1;
        lVar9 = lVar10 + 0x10;
      } while (uVar8 < (ulong)((long)pvStack_2e0 - (long)local_2e8 >> 4));
      local_34c = (float)*(int *)((long)local_2e8 + lVar10 + 8) * 30.1;
    }
    local_2b8._0_8_ = (Size *)((long)&local_2b8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"reference","");
    local_378.field_2._M_allocated_capacity = 0;
    local_378._M_dataplus._M_p._0_4_ = 0x1010000;
    local_378._M_string_length = (size_type)local_f0;
    cv::imshow((string *)&local_2b8,(_InputArray *)&local_378);
    if ((Size *)local_2b8._0_8_ != (Size *)((long)&local_2b8 + 0x10U)) {
      operator_delete((void *)local_2b8._0_8_,(long)local_2b8.sz + 1);
    }
    cv::VideoCapture::VideoCapture((VideoCapture *)&local_2b8);
    cv::VideoCapture::open((int)(_OutputArray *)&local_2b8,2);
    cVar2 = cv::VideoCapture::isOpened();
    if (cVar2 == '\0') {
      iVar3 = -1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR! Unable to open camera\n",0x1d);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start grabbing",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      poVar4 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Press any key to terminate",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      local_34c = (local_34c / 14.3) * 14.3;
      do {
        iVar3 = (int)puVar7;
        local_378.field_2._M_allocated_capacity = 0;
        local_378._M_dataplus._M_p._0_4_ = 0x2010000;
        local_378._M_string_length = (size_type)local_1b0;
        cv::VideoCapture::read((_OutputArray *)&local_2b8);
        cVar2 = cv::Mat::empty();
        if (cVar2 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR! blank frame grabbed\n",0x1b);
          iVar3 = 0;
          goto LAB_00102ccc;
        }
        local_378.field_2._M_allocated_capacity = 0;
        local_378._M_dataplus._M_p._0_4_ = 0x1010000;
        local_378._M_string_length = (size_type)local_1b0;
        local_328.sz.width = 0;
        local_328.sz.height = 0;
        local_328.flags = 0x2010000;
        local_328.obj = local_150;
        cv::cvtColor((cv *)&local_378,&local_328,(_OutputArray *)0x6,0,iVar3);
        local_2f8 = 0;
        local_308 = (void *)0x0;
        pvStack_300 = (void *)0x0;
        local_378.field_2._M_allocated_capacity = 0;
        local_378._M_dataplus._M_p._0_4_ = 0x1010000;
        local_240 = 0;
        local_248 = 0;
        puVar11 = &local_248;
        puVar7 = (undefined8 *)0x0;
        local_378._M_string_length = (size_type)local_150;
        cv::CascadeClassifier::detectMultiScale
                  (0xcccccccd,local_2c8,&local_378,&local_308,3,0,&local_240,puVar11);
        if (pvStack_300 != local_308) {
          lVar9 = 0xc;
          uVar8 = 0;
          do {
            cord_x = *(int *)((long)local_308 + lVar9 + -0xc);
            cord_y = *(int *)((long)local_308 + lVar9 + -8);
            cord_w = *(int *)((long)local_308 + lVar9 + -4);
            cord_height = *(int *)((long)local_308 + lVar9);
            puVar1 = (undefined4 *)((long)local_308 + lVar9 + -0xc);
            local_1e0 = *puVar1;
            uStack_1dc = puVar1[1];
            uStack_1d8 = puVar1[2];
            uStack_1d4 = puVar1[3];
            local_328.sz.width = 0;
            local_328.sz.height = 0;
            local_328.flags = 0x3010000;
            local_328.obj = local_1b0;
            local_378._M_dataplus._M_p = (pointer)0x0;
            local_378._M_string_length = 0x406fe00000000000;
            local_378.field_2._M_allocated_capacity = 0x406fe00000000000;
            local_378.field_2._8_8_ = 0;
            cv::rectangle(&local_328,&local_1e0,&local_378,2,8,0);
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                      (&local_378,vsnprintf,0x3a,"%f",SUB84((double)(local_34c / (float)cord_w),0));
            uStack_1e8 = 0;
            local_1f8[0] = 0x3010000;
            local_1f0 = local_1b0;
            std::operator+(&local_218,"Distance= ",&local_378);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
            pSVar6 = (Size *)(plVar5 + 2);
            if ((Size *)*plVar5 == pSVar6) {
              local_328.sz = *pSVar6;
              lStack_310 = plVar5[3];
              local_328._0_8_ = &local_328.sz;
            }
            else {
              local_328.sz = *pSVar6;
              local_328._0_8_ = (Size *)*plVar5;
            }
            local_328.obj = (void *)plVar5[1];
            *plVar5 = (long)pSVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            local_250 = 0x3200000032;
            local_238 = 0x406fe00000000000;
            uStack_230 = 0;
            local_228 = 0x406fe00000000000;
            uStack_220 = 0;
            puVar11 = (undefined8 *)((ulong)puVar11 & 0xffffffff00000000);
            puVar7 = &local_238;
            cv::putText(0x66666666,local_1f8,&local_328,&local_250,2,puVar7,2,puVar11,0);
            if ((Size *)local_328._0_8_ != &local_328.sz) {
              operator_delete((void *)local_328._0_8_,(ulong)((long)local_328.sz + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar8 < (ulong)((long)pvStack_300 - (long)local_308 >> 4));
        }
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Gray","");
        local_328.sz.width = 0;
        local_328.sz.height = 0;
        local_328.flags = 0x1010000;
        local_328.obj = local_150;
        cv::imshow((string *)&local_378,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Live","");
        local_328.sz.width = 0;
        local_328.sz.height = 0;
        local_328.flags = 0x1010000;
        local_328.obj = local_1b0;
        cv::imshow((string *)&local_378,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        iVar3 = cv::waitKey(1);
        if (local_308 != (void *)0x0) {
          operator_delete(local_308,local_2f8 - (long)local_308);
        }
      } while (iVar3 < 0);
      iVar3 = 0;
    }
LAB_00102ccc:
    cv::VideoCapture::~VideoCapture((VideoCapture *)&local_2b8);
    if (local_2e8 != (void *)0x0) {
      operator_delete(local_2e8,local_2d8 - (long)local_2e8);
    }
    cv::Mat::~Mat(local_f0);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_1b0);
  cv::CascadeClassifier::~CascadeClassifier(local_2c8);
  return iVar3;
}

Assistant:

int main(int, char**)

{
    //defining face detector uisng haarcasecde opencv
    //distance calculation data
    int face_width;// it will be width of 

    float focal_length;
    float orginal_distnace = 30.1;// Inches
    float Real_face_width = 14.3; //inches
    float face_width_in_image ;
    float distance;
    // int Distnace_R ;

    //===========
    //face detector object
    CascadeClassifier FaceDectector;
   // Variables 
    double scale_factor;
    int NNB;
   // Mat objects for images 
    Mat frame;
    Mat Gray;
    Mat G_Blur;

    //define the path of xml file
    string Xml_path = "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/haarcascade_frontalface_default.xml";
    if (!FaceDectector.load(Xml_path))
    {
        cout << "erro loading file xml face detector";
        return -1;

    }
    else {
        cout << "HarrCascade xml  file is Loaded";
    }
    Mat Reference_image;
    //reading the reference image from directory
    Reference_image = imread("C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/reference_image.png", IMREAD_GRAYSCALE);
    //std::vector<Rect> faces;
    std::vector<Rect> R_face;

    FaceDectector.detectMultiScale(Reference_image, R_face, 1.3);
 
    cout << "before---------------------";
    for (size_t j = 0; j < R_face.size(); j++) {
        cout << "reading===========";
        cout << R_face[j].x;
        Rect bbox = Rect(R_face[j].x, R_face[j].y, R_face[j].width, R_face[j].height);
        rectangle(Reference_image,bbox, Scalar(0, 255, 255), 2, 8, 0);
        face_width_in_image = R_face[j].width;
        

    }
    imshow("reference", Reference_image);
 
    focal_length = FocalLengthFinder(orginal_distnace, Real_face_width, face_width_in_image);

       //--- INITIALIZE VIDEOCAPTURE
    VideoCapture cap;
    // open the default camera using default API
    // cap.open(0);
    // OR advance usage: select any API backend
    int deviceID = 2;             // 0 = open default camera
    int apiID = cv::CAP_ANY;      // 0 = autodetect default API
    // open selected camera using selected API
    cap.open(deviceID, apiID);
    // check if we succeeded
    if (!cap.isOpened()) {
        cerr << "ERROR! Unable to open camera\n";
        return -1;
    }
    //--- GRAB AND WRITE LOOP
    cout << "Start grabbing" << endl
        << "Press any key to terminate" << endl;
    for (;;)
    {
        // wait for a new frame from camera and store it into 'frame'
        cap.read(frame);
        // check if we succeeded
        if (frame.empty()) {
            cerr << "ERROR! blank frame grabbed\n";
            break;
        }
        scale_factor = 1.3;
        NNB = 10;
        int flags = 3;
        // converting the color to gray 
        cvtColor(frame, Gray, COLOR_BGR2GRAY);
        
        // equalizeHist(Gray, Gray);
        // storing the face points in the vector
        vector<Rect> faces;
        FaceDectector.detectMultiScale(Gray, faces,scale_factor);
        for (size_t i = 0; i < faces.size(); i++) {
            //Point center(faces[i].x + faces[i].width / 2, faces[i].y + faces[i].height / 2);
            //ellipse(frame, center, Size(faces[i].width / 2, faces[i].height / 2), 0, 0, 360, Scalar(255, 0, 255), 4);
          //  Mat faceReginOf_intereset = Gray(faces[i]);
            cord_x = faces[i].x; cord_y = faces[i].y; cord_w = faces[i].width; cord_height = faces[i].height;
            //cout << cord_x, cord_y, cord_w, cord_height;
            Rect rec = Rect(faces[i].x, faces[i].y, faces[i].width,faces[i].height);
		    rectangle(frame, rec, Scalar(0, 255, 255), 2, 8, 0);
            distance = Distance_Finder(Real_face_width, focal_length, cord_w);
            // cout << "  ";
            // cout << distance, "  ";
            // Distnace_R = round(distance);
            // cout<<"Distnace = ", Distnace_R<<endl; 
            string s_distance= to_string(distance);
            

            // drwaing the  text on the Screen
            cv::putText(frame, "Distance= "+s_distance+" Inches", cv::Point(50, 50), cv::FONT_HERSHEY_DUPLEX, 0.7, cv::Scalar(255, 0, 255), 2, false);
            // cout << "   ";
            //cout << focal_length;
        
        }

        //GaussianBlur(Gray, G_Blur, Size(3, 3), 0);
        // show live and wait for a key with timeout long enough to show images
        imshow("Gray", Gray);
        imshow("Live", frame);
        if (waitKey(1) >= 0)
            break;
    }
    // the camera will be deinitialized automatically in VideoCapture destructor
    return 0;
}